

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_utils.h
# Opt level: O0

void config_target_level(AV1_COMP *cpi,AV1_LEVEL target_level,int tier)

{
  undefined4 uVar1;
  AV1_LEVEL in_SIL;
  long *in_RDI;
  double dVar2;
  double min_cr;
  int still_picture;
  int tile_cols;
  int max_tile_cols;
  int max_tiles;
  FIRSTPASS_STATS *stats;
  TWO_PASS *twopass;
  int64_t max_bitrate;
  double level_bitrate_limit;
  BITSTREAM_PROFILE profile;
  RateControlCfg *rc_cfg;
  TileConfig *tile_cfg;
  SequenceHeader *seq_params;
  AV1EncoderConfig *oxcf;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  AV1_LEVEL in_stack_ffffffffffffff87;
  bool bVar3;
  long local_78;
  int local_60;
  int local_5c;
  long local_58;
  long local_50;
  long local_48;
  double local_40;
  undefined1 local_31;
  long *local_30;
  long *local_28;
  long local_20;
  long *local_18;
  AV1_LEVEL local_9;
  long *local_8;
  
  local_18 = in_RDI + 0x8464;
  local_20 = in_RDI[0x8401];
  local_28 = in_RDI + 0x848d;
  local_30 = in_RDI + 0x8472;
  local_31 = *(undefined1 *)(local_20 + 0x45);
  local_9 = in_SIL;
  local_8 = in_RDI;
  local_40 = av1_get_max_bitrate_for_level
                       (in_stack_ffffffffffffff87,in_stack_ffffffffffffff80,
                        (BITSTREAM_PROFILE)((uint)in_stack_ffffffffffffff7c >> 0x18));
  local_48 = (long)(local_40 * 0.7);
  local_78 = local_48;
  if (local_30[3] < local_48) {
    local_78 = local_30[3];
  }
  local_30[3] = local_78;
  local_50 = *local_8 + 0x5bc0;
  local_58 = *(long *)(*(long *)(*local_8 + 0x5d58) + 0x18);
  if (local_58 != 0) {
    *(long *)(*local_8 + 0x8ad8) =
         (long)((*(double *)(local_58 + 0xa8) * (double)local_30[3]) / 10000000.0);
  }
  *(undefined4 *)((long)local_30 + 0x3c) = 0;
  *(undefined4 *)(local_30 + 8) = 0xff;
  av1_get_max_tiles_for_level(local_9,&local_5c,&local_60);
  while( true ) {
    bVar3 = false;
    if (0 < (int)local_28[1]) {
      bVar3 = local_60 < 1 << ((byte)(int)local_28[1] & 0x1f);
    }
    if (!bVar3) break;
    *(int *)(local_28 + 1) = (int)local_28[1] + -1;
  }
  while( true ) {
    bVar3 = false;
    if (0 < *(int *)((long)local_28 + 0xc)) {
      bVar3 = local_5c <
              (1 << ((byte)(int)local_28[1] & 0x1f)) *
              (1 << ((byte)*(undefined4 *)((long)local_28 + 0xc) & 0x1f));
    }
    if (!bVar3) break;
    *(int *)((long)local_28 + 0xc) = *(int *)((long)local_28 + 0xc) + -1;
  }
  dVar2 = av1_get_min_cr_for_level('\0',in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  if ((uint)(long)(dVar2 * 100.0) < *(uint *)(local_30 + 6)) {
    uVar1 = (undefined4)local_30[6];
  }
  else {
    uVar1 = (undefined4)(long)(dVar2 * 100.0);
  }
  *(undefined4 *)(local_30 + 6) = uVar1;
  return;
}

Assistant:

static inline void config_target_level(AV1_COMP *const cpi,
                                       AV1_LEVEL target_level, int tier) {
  AV1EncoderConfig *const oxcf = &cpi->oxcf;
  SequenceHeader *const seq_params = cpi->common.seq_params;
  TileConfig *const tile_cfg = &oxcf->tile_cfg;
  RateControlCfg *const rc_cfg = &oxcf->rc_cfg;

  // Adjust target bitrate to be no larger than 70% of level limit.
  const BITSTREAM_PROFILE profile = seq_params->profile;
  const double level_bitrate_limit =
      av1_get_max_bitrate_for_level(target_level, tier, profile);
  const int64_t max_bitrate = (int64_t)(level_bitrate_limit * 0.70);
  rc_cfg->target_bandwidth = AOMMIN(rc_cfg->target_bandwidth, max_bitrate);
  // Also need to update cpi->ppi->twopass.bits_left.
  TWO_PASS *const twopass = &cpi->ppi->twopass;
  FIRSTPASS_STATS *stats = twopass->stats_buf_ctx->total_stats;
  if (stats != NULL)
    cpi->ppi->twopass.bits_left =
        (int64_t)(stats->duration * rc_cfg->target_bandwidth / 10000000.0);

  // Adjust max over-shoot percentage.
  rc_cfg->over_shoot_pct = 0;

  // Adjust max quantizer.
  rc_cfg->worst_allowed_q = 255;

  // Adjust number of tiles and tile columns to be under level limit.
  int max_tiles, max_tile_cols;
  av1_get_max_tiles_for_level(target_level, &max_tiles, &max_tile_cols);
  while (tile_cfg->tile_columns > 0 &&
         (1 << tile_cfg->tile_columns) > max_tile_cols) {
    --tile_cfg->tile_columns;
  }
  const int tile_cols = (1 << tile_cfg->tile_columns);
  while (tile_cfg->tile_rows > 0 &&
         tile_cols * (1 << tile_cfg->tile_rows) > max_tiles) {
    --tile_cfg->tile_rows;
  }

  // Adjust min compression ratio.
  const int still_picture = seq_params->still_picture;
  const double min_cr =
      av1_get_min_cr_for_level(target_level, tier, still_picture);
  rc_cfg->min_cr = AOMMAX(rc_cfg->min_cr, (unsigned int)(min_cr * 100));
}